

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_search_tree_kernel_1.h
# Opt level: O0

void __thiscall
dlib::
binary_search_tree_kernel_1<dlib::connection_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::connection_*>_>
::rotate_right(binary_search_tree_kernel_1<dlib::connection_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::connection_*>_>
               *this,node **t)

{
  node *pnVar1;
  node *temp;
  node **t_local;
  binary_search_tree_kernel_1<dlib::connection_*,_char,_dlib::memory_manager_stateless_kernel_1<char>,_std::less<dlib::connection_*>_>
  *this_local;
  
  if ((*t)->left->balance == -1) {
    (*t)->balance = '\0';
    (*t)->left->balance = '\0';
  }
  else {
    (*t)->balance = -1;
    (*t)->left->balance = '\x01';
  }
  pnVar1 = (*t)->left;
  (*t)->left = pnVar1->right;
  pnVar1->right = *t;
  *t = pnVar1;
  return;
}

Assistant:

void binary_search_tree_kernel_1<domain,range,mem_manager,compare>::
    rotate_right (
        node*& t
    ) 
    {
        // set the new balance numbers
        if (t->left->balance == -1)
        {
            t->balance = 0;
            t->left->balance = 0;
        }
        else
        {
            t->balance = -1;
            t->left->balance = 1;            
        }

        // preform the rotation
        node* temp = t->left;
        t->left = temp->right;
        temp->right = t;
        t = temp;    

    }